

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::IsEndOfAlternative
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  EncodedChar EVar1;
  bool bVar2;
  
  EVar1 = ECLookahead(this,0);
  bVar2 = true;
  if (((EVar1 != L'|') && (EVar1 != L')')) && ((EVar1 != L'\0' || (this->next < this->inputLim)))) {
    bVar2 = EVar1 == L'/';
  }
  return bVar2;
}

Assistant:

inline bool Parser<P, IsLiteral>::IsEndOfAlternative()
    {
        EncodedChar ec = ECLookahead();
        // Could be terminating 0, but embedded 0 is part of alternative
        return (ec == 0 && IsEOF()) || ec == ')' || ec == '|' || (IsLiteral && ec == '/');
    }